

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

void logmatch(logdir *ld)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  
  ld->match = '+';
  ld->matcherr = 'E';
  if ((ld->inst).len != 0) {
    uVar4 = 0;
    do {
      pcVar5 = (ld->inst).s;
      bVar1 = pcVar5[(int)uVar4];
      if (bVar1 < 0x45) {
        if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
          iVar2 = pmatch(pcVar5 + (long)(int)uVar4 + 1,line,(uint)linelen);
          pcVar5 = (ld->inst).s;
          if (iVar2 != 0) {
            ld->match = pcVar5[(int)uVar4];
          }
        }
      }
      else if ((bVar1 == 0x45) || (bVar1 == 0x65)) {
        iVar2 = pmatch(pcVar5 + (long)(int)uVar4 + 1,line,(uint)linelen);
        pcVar5 = (ld->inst).s;
        if (iVar2 != 0) {
          ld->matcherr = pcVar5[(int)uVar4];
        }
      }
      uVar3 = byte_chr(pcVar5 + (int)uVar4,(ld->inst).len - uVar4,0);
      uVar4 = uVar3 + uVar4 + 1;
    } while (uVar4 < (ld->inst).len);
  }
  return;
}

Assistant:

void logmatch(struct logdir *ld) {
  int i;

  ld->match ='+';
  ld->matcherr ='E';
  for (i =0; i < ld->inst.len; ++i) {
    switch(ld->inst.s[i]) {
    case '+':
    case '-':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->match =ld->inst.s[i];
      break;
    case 'e':
    case 'E':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->matcherr =ld->inst.s[i];
      break;
    }
    i +=byte_chr(&ld->inst.s[i], ld->inst.len -i, 0);
  }
}